

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

bool leveldb::GetVarint32(Slice *input,uint32_t *value)

{
  long lVar1;
  uint32_t *value_00;
  size_t sVar2;
  Slice *this;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  char *q;
  char *limit;
  char *p;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  char *in_stack_ffffffffffffffb8;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  value_00 = (uint32_t *)
             Slice::data((Slice *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  sVar2 = Slice::size((Slice *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  this = (Slice *)GetVarint32Ptr((char *)((long)value_00 + sVar2),in_stack_ffffffffffffffb8,value_00
                                );
  if (this != (Slice *)0x0) {
    Slice::Slice(this,(char *)value_00,CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8)
                );
    *in_RDI = local_18;
    in_RDI[1] = local_10;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this != (Slice *)0x0;
}

Assistant:

bool GetVarint32(Slice* input, uint32_t* value) {
  const char* p = input->data();
  const char* limit = p + input->size();
  const char* q = GetVarint32Ptr(p, limit, value);
  if (q == nullptr) {
    return false;
  } else {
    *input = Slice(q, limit - q);
    return true;
  }
}